

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O0

string * __thiscall
supermap::
Supermap<supermap::Key<30ul>,supermap::MaybeRemovedValue<supermap::ByteArray<100ul>>,unsigned_long>
::getNewBlockName_abi_cxx11_
          (Supermap<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>
           *this)

{
  pointer pSVar1;
  string *in_RDI;
  size_t in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  Supermap<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>
  *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_50 [32];
  string local_30 [48];
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90);
  pSVar1 = std::
           unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>_>
           ::operator->((unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>_>
                         *)0x12b646);
  (*(pSVar1->
    super_OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_unsigned_long,_void>
    )._vptr_OrderedStorage[1])
            (&pSVar1->
              super_OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_unsigned_long,_void>
            );
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffffa8);
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Supermap<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>
  ::addRandomString(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

[[nodiscard]] std::string getNewBlockName() const {
        return addRandomString(indexFilesPrefix + "block-" + std::to_string(diskIndex_->getItemsCount()));
    }